

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

stumpless_target * stumpless_set_transport_port(stumpless_target *target,char *port)

{
  network_target *target_00;
  char *mem;
  char *mem_00;
  char *old_port;
  network_target *net_target;
  char *port_copy;
  char *port_local;
  stumpless_target *target_local;
  
  if (target == (stumpless_target *)0x0) {
    raise_argument_empty("target was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else if (port == (char *)0x0) {
    raise_argument_empty("port was NULL");
    target_local = (stumpless_target *)0x0;
  }
  else {
    mem_00 = copy_cstring(port);
    if (mem_00 == (char *)0x0) {
      target_local = (stumpless_target *)0x0;
    }
    else {
      lock_target(target);
      if (target->type == STUMPLESS_NETWORK_TARGET) {
        target_00 = (network_target *)target->id;
        mem = target_00->port;
        target_00->port = mem_00;
        clear_error();
        reopen_network_target(target_00);
        unlock_target(target);
        free_mem(mem);
        target_local = target;
      }
      else {
        raise_target_incompatible("transport ports are only valid for network targets");
        unlock_target(target);
        free_mem(mem_00);
        target_local = (stumpless_target *)0x0;
      }
    }
  }
  return target_local;
}

Assistant:

struct stumpless_target *
stumpless_set_transport_port( struct stumpless_target *target,
                              const char *port ) {
  const char *port_copy;
  struct network_target *net_target;
  const char *old_port;

  VALIDATE_ARG_NOT_NULL( target );
  VALIDATE_ARG_NOT_NULL( port );

  port_copy = copy_cstring( port );
  if( !port_copy ) {
    return NULL;
  }

  lock_target( target );
  if( target->type != STUMPLESS_NETWORK_TARGET ) {
    raise_target_incompatible( L10N_TRANSPORT_PORT_NETWORK_ONLY_ERROR_MESSAGE );
    goto cleanup_and_fail;
  }

  net_target = target->id;
  old_port = net_target->port;
  net_target->port = port_copy;
  clear_error(  );

  reopen_network_target( net_target );

  unlock_target( target );
  free_mem( old_port );
  return target;

cleanup_and_fail:
  unlock_target( target );
  free_mem( port_copy );
  return NULL;
}